

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O2

void __thiscall despot::RegDemo::PrintState(RegDemo *this,State *s,ostream *out)

{
  int x;
  ulong uVar1;
  char *pcVar2;
  char buffer [20];
  char acStack_48 [24];
  
  for (uVar1 = 0; (long)uVar1 < (long)this->size_; uVar1 = uVar1 + 1) {
    if (uVar1 == this->size_ - 1) {
      pcVar2 = "G     ";
      if (uVar1 == *(uint *)(s + 0xc)) {
        pcVar2 = "T     ";
      }
    }
    else {
      pcVar2 = "R     ";
      if (uVar1 != *(uint *)(s + 0xc)) {
        sprintf(acStack_48,"%4.3f ",
                (this->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar1]);
        pcVar2 = acStack_48;
      }
    }
    std::operator<<(out,pcVar2);
  }
  std::endl<char,std::char_traits<char>>(out);
  return;
}

Assistant:

void RegDemo::PrintState(const State& s, ostream& out) const {
	char buffer[20];
	for (int x = 0; x < size_; x++) {
		if (x == size_ - 1) {
			if (s.state_id == x)
				out << "T     ";
			else
				out << "G     ";
		} else {
			if (s.state_id == x)
				out << "R     ";
			else {
				sprintf(buffer, "%4.3f ", trap_prob_[x]);
				out << buffer;
			}
		}
	}
	out << endl;
}